

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *o,PairList *e)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  
  p_Var2 = (e->pairSet_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(e->pairSet_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(o,"pairList[",9);
      poVar1 = (ostream *)std::ostream::operator<<(o,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] i, j: ",8);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,p_Var2[1]._M_color);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," - ",3);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&p_Var2[1].field_0x4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      iVar3 = iVar3 + 1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, PairList& e) {
    std::set<std::pair<int, int>>::iterator i;

    int index;

    index = 0;

    for (i = e.pairSet_.begin(); i != e.pairSet_.end(); ++i) {
      o << "pairList[" << index << "] i, j: " << (*i).first << " - "
        << (*i).second << "\n";
      index++;
    }

    return o;
  }